

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SpectrumConstantTexture *
pbrt::SpectrumConstantTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  SpectrumConstantTexture *pSVar1;
  polymorphic_allocator<std::byte> *in_RCX;
  SpectrumHandle *in_RSI;
  SpectrumHandle c;
  SpectrumHandle one;
  SpectrumHandle *in_stack_ffffffffffffff68;
  SpectrumHandle *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  SpectrumHandle *args;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff80;
  SpectrumType in_stack_ffffffffffffff9c;
  allocator<char> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  Allocator in_stack_ffffffffffffffb8;
  
  pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
            (in_stack_ffffffffffffff70,(ConstantSpectrum *)in_stack_ffffffffffffff68);
  args = (SpectrumHandle *)&stack0xffffffffffffffa7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  SpectrumHandle::SpectrumHandle(in_RSI,in_stack_ffffffffffffff68);
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (SpectrumHandle *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  pSVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SpectrumConstantTexture,pbrt::SpectrumHandle&>(in_RCX,args);
  return pSVar1;
}

Assistant:

SpectrumConstantTexture *SpectrumConstantTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    SpectrumHandle c =
        parameters.GetOneSpectrum("value", one, SpectrumType::Reflectance, alloc);
    return alloc.new_object<SpectrumConstantTexture>(c);
}